

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

void Imath_3_2::maxEigenVector<Imath_3_2::Matrix44<double>,Imath_3_2::Vec4<double>>
               (Matrix44<double> *A,Vec4<double> *V)

{
  double dVar1;
  undefined4 uVar2;
  int iVar3;
  uint i;
  long lVar4;
  int iVar5;
  Vec4<double> S;
  Matrix44<double> MV;
  Vec4<double> local_a8;
  Matrix44<double> local_88;
  
  local_88.x[0][0] = 1.0;
  local_88.x[0][1] = 0.0;
  local_88.x[0][2] = 0.0;
  local_88.x[0][3] = 0.0;
  local_88.x[1][0] = 0.0;
  local_88.x[1][1] = 1.0;
  local_88.x[1][2] = 0.0;
  local_88.x[1][3] = 0.0;
  local_88.x[2][0] = 0.0;
  local_88.x[2][1] = 0.0;
  local_88.x[2][2] = 1.0;
  local_88.x[2][3] = 0.0;
  local_88.x[3][0] = 0.0;
  local_88.x[3][1] = 0.0;
  local_88.x[3][2] = 0.0;
  local_88.x[3][3] = 1.0;
  jacobiEigenSolver<double>(A,&local_a8,&local_88,2.220446049250313e-16);
  iVar5 = 0;
  lVar4 = 1;
  do {
    iVar3 = (int)lVar4;
    if (ABS((&local_a8.x)[lVar4]) <= ABS((&local_a8.x)[iVar5])) {
      iVar3 = iVar5;
    }
    iVar5 = iVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = (long)iVar5;
  uVar2 = *(undefined4 *)((long)local_88.x[2] + lVar4 * 8 + 4);
  dVar1 = local_88.x[3][lVar4];
  *(undefined4 *)&V->z = *(undefined4 *)(local_88.x[2] + lVar4);
  *(undefined4 *)((long)&V->z + 4) = uVar2;
  *(int *)&V->w = SUB84(dVar1,0);
  *(int *)((long)&V->w + 4) = (int)((ulong)dVar1 >> 0x20);
  return;
}

Assistant:

void
maxEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver (A, S, MV);

    int maxIdx (0);
    for (unsigned int i = 1; i < TV::dimensions (); ++i)
    {
        if (std::abs (S[i]) > std::abs (S[maxIdx])) maxIdx = i;
    }

    for (unsigned int i = 0; i < TV::dimensions (); ++i)
        V[i] = MV[i][maxIdx];
}